

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O1

bool SHA1_ValidateHelper(char *str,ON__UINT8 *standard)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  ON__UINT64 sizeof_buffer;
  ON__UINT64 OVar4;
  ON__UINT64 sizeof_buffer_00;
  ulong sizeof_buffer_01;
  ON__UINT64 sizeof_buffer_02;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ON_SHA1_Hash sha1_digest1;
  ON_SHA1_Hash sha1_digest;
  char *local_100;
  long local_f8;
  ON_SHA1_Hash local_e0;
  ON_SHA1_Hash local_cc;
  ON_SHA1 local_b8;
  
  iVar3 = ON_String::Length(str);
  local_b8.m_state[2] = 0;
  local_b8.m_state[3] = 0;
  local_b8.m_state[4] = 0;
  local_b8.m_bit_count[0] = 0;
  local_b8.m_bit_count[1] = 0;
  local_b8.m_state[0] = 0;
  local_b8.m_state[1] = 0;
  local_b8.m_buffer[0x30] = '\0';
  local_b8.m_buffer[0x31] = '\0';
  local_b8.m_buffer[0x32] = '\0';
  local_b8.m_buffer[0x33] = '\0';
  local_b8.m_buffer[0x34] = '\0';
  local_b8.m_buffer[0x35] = '\0';
  local_b8.m_buffer[0x36] = '\0';
  local_b8.m_buffer[0x37] = '\0';
  local_b8.m_buffer[0x38] = '\0';
  local_b8.m_buffer[0x39] = '\0';
  local_b8.m_buffer[0x3a] = '\0';
  local_b8.m_buffer[0x3b] = '\0';
  local_b8.m_buffer[0x3c] = '\0';
  local_b8.m_buffer[0x3d] = '\0';
  local_b8.m_buffer[0x3e] = '\0';
  local_b8.m_buffer[0x3f] = '\0';
  local_b8.m_buffer[0x20] = '\0';
  local_b8.m_buffer[0x21] = '\0';
  local_b8.m_buffer[0x22] = '\0';
  local_b8.m_buffer[0x23] = '\0';
  local_b8.m_buffer[0x24] = '\0';
  local_b8.m_buffer[0x25] = '\0';
  local_b8.m_buffer[0x26] = '\0';
  local_b8.m_buffer[0x27] = '\0';
  local_b8.m_buffer[0x28] = '\0';
  local_b8.m_buffer[0x29] = '\0';
  local_b8.m_buffer[0x2a] = '\0';
  local_b8.m_buffer[0x2b] = '\0';
  local_b8.m_buffer[0x2c] = '\0';
  local_b8.m_buffer[0x2d] = '\0';
  local_b8.m_buffer[0x2e] = '\0';
  local_b8.m_buffer[0x2f] = '\0';
  local_b8.m_buffer[0x10] = '\0';
  local_b8.m_buffer[0x11] = '\0';
  local_b8.m_buffer[0x12] = '\0';
  local_b8.m_buffer[0x13] = '\0';
  local_b8.m_buffer[0x14] = '\0';
  local_b8.m_buffer[0x15] = '\0';
  local_b8.m_buffer[0x16] = '\0';
  local_b8.m_buffer[0x17] = '\0';
  local_b8.m_buffer[0x18] = '\0';
  local_b8.m_buffer[0x19] = '\0';
  local_b8.m_buffer[0x1a] = '\0';
  local_b8.m_buffer[0x1b] = '\0';
  local_b8.m_buffer[0x1c] = '\0';
  local_b8.m_buffer[0x1d] = '\0';
  local_b8.m_buffer[0x1e] = '\0';
  local_b8.m_buffer[0x1f] = '\0';
  local_b8.m_buffer[0] = '\0';
  local_b8.m_buffer[1] = '\0';
  local_b8.m_buffer[2] = '\0';
  local_b8.m_buffer[3] = '\0';
  local_b8.m_buffer[4] = '\0';
  local_b8.m_buffer[5] = '\0';
  local_b8.m_buffer[6] = '\0';
  local_b8.m_buffer[7] = '\0';
  local_b8.m_buffer[8] = '\0';
  local_b8.m_buffer[9] = '\0';
  local_b8.m_buffer[10] = '\0';
  local_b8.m_buffer[0xb] = '\0';
  local_b8.m_buffer[0xc] = '\0';
  local_b8.m_buffer[0xd] = '\0';
  local_b8.m_buffer[0xe] = '\0';
  local_b8.m_buffer[0xf] = '\0';
  local_b8.m_byte_count = 0;
  local_b8.m_status_bits = 0;
  local_b8.m_reserved = 0;
  ON_SHA1_Hash::ON_SHA1_Hash(&local_b8.m_sha1_hash);
  sizeof_buffer_00 = (ON__UINT64)iVar3;
  ON_SHA1::AccumulateBytes(&local_b8,str,sizeof_buffer_00);
  ON_SHA1::Hash(&local_cc,&local_b8);
  auVar6[0] = -(local_cc.m_digest[0] == *standard);
  auVar6[1] = -(local_cc.m_digest[1] == standard[1]);
  auVar6[2] = -(local_cc.m_digest[2] == standard[2]);
  auVar6[3] = -(local_cc.m_digest[3] == standard[3]);
  auVar6[4] = -(local_cc.m_digest[4] == standard[4]);
  auVar6[5] = -(local_cc.m_digest[5] == standard[5]);
  auVar6[6] = -(local_cc.m_digest[6] == standard[6]);
  auVar6[7] = -(local_cc.m_digest[7] == standard[7]);
  auVar6[8] = -(local_cc.m_digest[8] == standard[8]);
  auVar6[9] = -(local_cc.m_digest[9] == standard[9]);
  auVar6[10] = -(local_cc.m_digest[10] == standard[10]);
  auVar6[0xb] = -(local_cc.m_digest[0xb] == standard[0xb]);
  auVar6[0xc] = -(local_cc.m_digest[0xc] == standard[0xc]);
  auVar6[0xd] = -(local_cc.m_digest[0xd] == standard[0xd]);
  auVar6[0xe] = -(local_cc.m_digest[0xe] == standard[0xe]);
  auVar6[0xf] = -(local_cc.m_digest[0xf] == standard[0xf]);
  uVar1 = *(undefined4 *)(standard + 0x10);
  auVar8[0] = -(local_cc.m_digest[0x10] == (ON__UINT8)uVar1);
  auVar8[1] = -(local_cc.m_digest[0x11] == (ON__UINT8)((uint)uVar1 >> 8));
  auVar8[2] = -(local_cc.m_digest[0x12] == (ON__UINT8)((uint)uVar1 >> 0x10));
  auVar8[3] = -(local_cc.m_digest[0x13] == (ON__UINT8)((uint)uVar1 >> 0x18));
  auVar8[4] = 0xff;
  auVar8[5] = 0xff;
  auVar8[6] = 0xff;
  auVar8[7] = 0xff;
  auVar8[8] = 0xff;
  auVar8[9] = 0xff;
  auVar8[10] = 0xff;
  auVar8[0xb] = 0xff;
  auVar8[0xc] = 0xff;
  auVar8[0xd] = 0xff;
  auVar8[0xe] = 0xff;
  auVar8[0xf] = 0xff;
  auVar8 = auVar8 & auVar6;
  if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) == 0xffff) {
    if (iVar3 < 0) {
      bVar5 = true;
    }
    else {
      bVar5 = true;
      local_f8 = 1;
      sizeof_buffer_01 = 0;
      OVar4 = sizeof_buffer_00;
      local_100 = str;
      do {
        if (bVar5) {
          sizeof_buffer_02 = 0;
          sizeof_buffer = OVar4;
          do {
            local_b8.m_byte_count = 0;
            local_b8.m_bit_count[0] = 0;
            local_b8.m_bit_count[1] = 0;
            local_b8.m_state[0] = 0x67452301;
            local_b8.m_state[1] = 0xefcdab89;
            local_b8.m_state[2] = 0x98badcfe;
            local_b8.m_state[3] = 0x10325476;
            local_b8.m_state[4] = 0xc3d2e1f0;
            local_b8.m_status_bits = 1;
            ON_SHA1::AccumulateBytes(&local_b8,str,sizeof_buffer_01);
            ON_SHA1::Hash(&local_e0,&local_b8);
            ON_SHA1::AccumulateBytes(&local_b8,str + sizeof_buffer_01,sizeof_buffer_02);
            ON_SHA1::Hash(&local_e0,&local_b8);
            ON_SHA1::AccumulateBytes(&local_b8,local_100 + sizeof_buffer_02,sizeof_buffer);
            ON_SHA1::Hash(&local_e0,&local_b8);
            auVar7[0] = -(local_e0.m_digest[0] == local_cc.m_digest[0]);
            auVar7[1] = -(local_e0.m_digest[1] == local_cc.m_digest[1]);
            auVar7[2] = -(local_e0.m_digest[2] == local_cc.m_digest[2]);
            auVar7[3] = -(local_e0.m_digest[3] == local_cc.m_digest[3]);
            auVar7[4] = -(local_e0.m_digest[4] == local_cc.m_digest[4]);
            auVar7[5] = -(local_e0.m_digest[5] == local_cc.m_digest[5]);
            auVar7[6] = -(local_e0.m_digest[6] == local_cc.m_digest[6]);
            auVar7[7] = -(local_e0.m_digest[7] == local_cc.m_digest[7]);
            auVar7[8] = -(local_e0.m_digest[8] == local_cc.m_digest[8]);
            auVar7[9] = -(local_e0.m_digest[9] == local_cc.m_digest[9]);
            auVar7[10] = -(local_e0.m_digest[10] == local_cc.m_digest[10]);
            auVar7[0xb] = -(local_e0.m_digest[0xb] == local_cc.m_digest[0xb]);
            auVar7[0xc] = -(local_e0.m_digest[0xc] == local_cc.m_digest[0xc]);
            auVar7[0xd] = -(local_e0.m_digest[0xd] == local_cc.m_digest[0xd]);
            auVar7[0xe] = -(local_e0.m_digest[0xe] == local_cc.m_digest[0xe]);
            auVar7[0xf] = -(local_e0.m_digest[0xf] == local_cc.m_digest[0xf]);
            auVar9[0] = -(local_e0.m_digest[0x10] == local_cc.m_digest[0x10]);
            auVar9[1] = -(local_e0.m_digest[0x11] == local_cc.m_digest[0x11]);
            auVar9[2] = -(local_e0.m_digest[0x12] == local_cc.m_digest[0x12]);
            auVar9[3] = -(local_e0.m_digest[0x13] == local_cc.m_digest[0x13]);
            auVar9[4] = 0xff;
            auVar9[5] = 0xff;
            auVar9[6] = 0xff;
            auVar9[7] = 0xff;
            auVar9[8] = 0xff;
            auVar9[9] = 0xff;
            auVar9[10] = 0xff;
            auVar9[0xb] = 0xff;
            auVar9[0xc] = 0xff;
            auVar9[0xd] = 0xff;
            auVar9[0xe] = 0xff;
            auVar9[0xf] = 0xff;
            auVar9 = auVar9 & auVar7;
            bVar5 = (ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff;
            if (sizeof_buffer_00 < local_f8 + sizeof_buffer_02) break;
            sizeof_buffer_02 = sizeof_buffer_02 + 1;
            sizeof_buffer = sizeof_buffer - 1;
          } while (bVar5);
        }
        if (sizeof_buffer_00 <= sizeof_buffer_01) break;
        sizeof_buffer_01 = sizeof_buffer_01 + 1;
        OVar4 = OVar4 - 1;
        local_100 = local_100 + 1;
        local_f8 = local_f8 + 1;
      } while (bVar5);
    }
    bVar2 = false;
    if (local_b8.m_byte_count == sizeof_buffer_00) {
      bVar2 = bVar5;
    }
    if (!bVar5) {
      bVar2 = bVar5;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool SHA1_ValidateHelper(
  const char* str,
  const ON__UINT8 standard[20]
  )
{
  const int str_length = ON_String::Length(str);
  ON_SHA1 sha1;
  sha1.AccumulateBytes(str, str_length);
  const ON_SHA1_Hash sha1_digest(sha1.Hash());
  if ( 0 != memcmp(standard, &sha1_digest, 20) )
    return false;

  bool rc = true;
  for (int i = 0; i <= str_length && rc; i++)
  {
    for (int j = 0; i+j <= str_length && rc; j++)
    {
      sha1.Reset();
      sha1.AccumulateBytes(str, i);
      sha1.Hash();
      sha1.AccumulateBytes(str+i, j);
      sha1.Hash();
      sha1.AccumulateBytes(str+i+j, str_length-i-j);
      ON_SHA1_Hash sha1_digest1(sha1.Hash());
      rc = ( sha1_digest == sha1_digest1 );
    }
  }

  if (rc)
  {
    if ( (ON__UINT64)str_length != sha1.ByteCount() )
      rc = false;
  }

  return rc;
}